

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O2

string * __thiscall
AutoArgParse::MissingMandatoryFlagException::makeErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,MissingMandatoryFlagException *this,FlagStore *flagStore)

{
  ostringstream os;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"Missing mandatory argument(s). valid option(s) are: ");
  printUnParsed((ostringstream *)local_190,
                (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this[1].super_ParseException.failureReason,
                (FlagMap *)&(this->super_ParseException).failureReason);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeErrorMessage(const FlagStore& flagStore) {
        std::ostringstream os;
        os << "Missing mandatory argument(s). valid option(s) are: ";
        printUnParsed(os, flagStore.flagInsertionOrder, flagStore.flags);
        return os.str();
    }